

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  IVal *fmt_00;
  Interval *pIVar1;
  IVal local_40;
  int local_24;
  IVal *pIStack_20;
  int ndx;
  IVal *value_local;
  FloatFormat *fmt_local;
  IVal *ret;
  
  pIStack_20 = value;
  value_local = (IVal *)fmt;
  fmt_local = (FloatFormat *)__return_storage_ptr__;
  tcu::Vector<tcu::Interval,_4>::Vector(__return_storage_ptr__);
  for (local_24 = 0; fmt_00 = value_local, local_24 < 4; local_24 = local_24 + 1) {
    pIVar1 = tcu::Vector<tcu::Interval,_4>::operator[](pIStack_20,local_24);
    convert<float>(&local_40,(FloatFormat *)fmt_00,pIVar1);
    pIVar1 = tcu::Vector<tcu::Interval,_4>::operator[](__return_storage_ptr__,local_24);
    pIVar1->m_hasNaN = local_40.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_40._1_7_;
    pIVar1->m_lo = local_40.m_lo;
    pIVar1->m_hi = local_40.m_hi;
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}